

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

long src_callback_read(SRC_STATE *state,double src_ratio,long frames,float *data)

{
  int iVar1;
  float **local_88;
  float *ptr;
  float dummy [1];
  int error;
  long output_frames_gen;
  SRC_DATA src_data;
  float *data_local;
  long frames_local;
  double src_ratio_local;
  SRC_STATE *state_local;
  
  ptr._4_4_ = SRC_ERR_NO_ERROR;
  if (state == (SRC_STATE *)0x0) {
    state_local = (SRC_STATE *)0x0;
  }
  else if (frames < 1) {
    state_local = (SRC_STATE *)0x0;
  }
  else if (state->mode == SRC_MODE_CALLBACK) {
    if (state->callback_func == (src_callback_t)0x0) {
      state->error = SRC_ERR_NULL_CALLBACK;
      state_local = (SRC_STATE *)0x0;
    }
    else {
      src_data.src_ratio = (double)data;
      memset(&output_frames_gen,0,0x40);
      iVar1 = is_bad_src_ratio(src_ratio);
      if (iVar1 == 0) {
        src_data.data_in = (float *)src_data.src_ratio;
        output_frames_gen = (long)state->saved_data;
        src_data.data_out = (float *)state->saved_frames;
        _dummy = (SRC_STATE *)0x0;
        src_data.input_frames = frames;
        src_data._48_8_ = src_ratio;
        do {
          if (frames <= (long)_dummy) break;
          if (src_data.data_out == (float *)0x0) {
            local_88 = &ptr;
            src_data.data_out =
                 (float *)(*state->callback_func)(state->user_callback_data,(float **)&local_88);
            output_frames_gen = (long)local_88;
            if (src_data.data_out == (float *)0x0) {
              src_data.output_frames_gen._0_4_ = 1;
            }
          }
          state->mode = SRC_MODE_PROCESS;
          ptr._4_4_ = src_process(state,(SRC_DATA *)&output_frames_gen);
          state->mode = SRC_MODE_CALLBACK;
          if (ptr._4_4_ != SRC_ERR_NO_ERROR) break;
          output_frames_gen = src_data.output_frames * state->channels * 4 + output_frames_gen;
          src_data.data_out = (float *)((long)src_data.data_out - src_data.output_frames);
          src_data.data_in = src_data.data_in + src_data.input_frames_used * state->channels;
          src_data.input_frames = src_data.input_frames - src_data.input_frames_used;
          _dummy = (SRC_STATE *)((long)&_dummy->vt + src_data.input_frames_used);
        } while (((int)src_data.output_frames_gen != 1) || (src_data.input_frames_used != 0));
        state->saved_data = (float *)output_frames_gen;
        state->saved_frames = (long)src_data.data_out;
        if (ptr._4_4_ == SRC_ERR_NO_ERROR) {
          state_local = _dummy;
        }
        else {
          state->error = ptr._4_4_;
          state_local = (SRC_STATE *)0x0;
        }
      }
      else {
        state->error = SRC_ERR_BAD_SRC_RATIO;
        state_local = (SRC_STATE *)0x0;
      }
    }
  }
  else {
    state->error = SRC_ERR_BAD_MODE;
    state_local = (SRC_STATE *)0x0;
  }
  return (long)state_local;
}

Assistant:

long
src_callback_read (SRC_STATE *state, double src_ratio, long frames, float *data)
{
	SRC_DATA	src_data ;

	long	output_frames_gen ;
	int		error = 0 ;

	if (state == NULL)
		return 0 ;

	if (frames <= 0)
		return 0 ;

	if (state->mode != SRC_MODE_CALLBACK)
	{	state->error = SRC_ERR_BAD_MODE ;
		return 0 ;
		} ;

	if (state->callback_func == NULL)
	{	state->error = SRC_ERR_NULL_CALLBACK ;
		return 0 ;
		} ;

	memset (&src_data, 0, sizeof (src_data)) ;

	/* Check src_ratio is in range. */
	if (is_bad_src_ratio (src_ratio))
	{	state->error = SRC_ERR_BAD_SRC_RATIO ;
		return 0 ;
		} ;

	/* Switch modes temporarily. */
	src_data.src_ratio = src_ratio ;
	src_data.data_out = data ;
	src_data.output_frames = frames ;

	src_data.data_in = state->saved_data ;
	src_data.input_frames = state->saved_frames ;

	output_frames_gen = 0 ;
	while (output_frames_gen < frames)
	{	/*	Use a dummy array for the case where the callback function
		**	returns without setting the ptr.
		*/
		float dummy [1] ;

		if (src_data.input_frames == 0)
		{	float *ptr = dummy ;

			src_data.input_frames = state->callback_func (state->user_callback_data, &ptr) ;
			src_data.data_in = ptr ;

			if (src_data.input_frames == 0)
				src_data.end_of_input = 1 ;
			} ;

		/*
		** Now call process function. However, we need to set the mode
		** to SRC_MODE_PROCESS first and when we return set it back to
		** SRC_MODE_CALLBACK.
		*/
		state->mode = SRC_MODE_PROCESS ;
		error = src_process (state, &src_data) ;
		state->mode = SRC_MODE_CALLBACK ;

		if (error != 0)
			break ;

		src_data.data_in += src_data.input_frames_used * state->channels ;
		src_data.input_frames -= src_data.input_frames_used ;

		src_data.data_out += src_data.output_frames_gen * state->channels ;
		src_data.output_frames -= src_data.output_frames_gen ;

		output_frames_gen += src_data.output_frames_gen ;

		if (src_data.end_of_input == SRC_TRUE && src_data.output_frames_gen == 0)
			break ;
		} ;

	state->saved_data = src_data.data_in ;
	state->saved_frames = src_data.input_frames ;

	if (error != 0)
	{	state->error = (SRC_ERROR) error ;
		return 0 ;
		} ;

	return output_frames_gen ;
}